

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# module-splitting.cpp
# Opt level: O0

void __thiscall
wasm::ModuleSplitting::anon_unknown_0::ModuleSplitter::indirectCallsToSecondaryFunctions::
CallIndirector::~CallIndirector(CallIndirector *this)

{
  CallIndirector *this_local;
  
  ~CallIndirector(this);
  operator_delete(this,0x118);
  return;
}

Assistant:

CallIndirector(ModuleSplitter& parent)
      : parent(parent), builder(parent.primary) {}